

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

ConfigLiblistSyntax * __thiscall slang::parsing::Parser::parseConfigLiblist(Parser *this)

{
  span<slang::parsing::Token,_18446744073709551615UL> elements;
  Token liblist_00;
  bool bVar1;
  __extent_storage<18446744073709551615UL> _Var2;
  ConfigLiblistSyntax *pCVar3;
  EVP_PKEY_CTX *src;
  pointer extraout_RDX;
  undefined8 *in_RDI;
  Token TVar4;
  SmallVector<slang::parsing::Token,_4UL> tokens;
  Token liblist;
  TokenList *in_stack_fffffffffffffeb8;
  SmallVectorBase<slang::parsing::Token> *in_stack_fffffffffffffec0;
  TokenList *this_00;
  undefined6 uVar5;
  TokenKind in_stack_fffffffffffffece;
  undefined2 uVar6;
  ParserBase *in_stack_fffffffffffffed0;
  ParserBase *in_stack_fffffffffffffee0;
  undefined8 in_stack_ffffffffffffff48;
  ParserBase *in_stack_ffffffffffffff50;
  ParserBase *in_stack_ffffffffffffff88;
  _Optional_payload_base<slang::DiagCode> in_stack_ffffffffffffff92;
  undefined4 extraout_var;
  
  ParserBase::expect(in_stack_ffffffffffffff50,(TokenKind)((ulong)in_stack_ffffffffffffff48 >> 0x30)
                    );
  SmallVector<slang::parsing::Token,_4UL>::SmallVector
            ((SmallVector<slang::parsing::Token,_4UL> *)0x321313);
  while (bVar1 = ParserBase::peek(in_stack_fffffffffffffed0,in_stack_fffffffffffffece), bVar1) {
    TVar4 = ParserBase::consume(in_stack_fffffffffffffee0);
    in_stack_fffffffffffffee0 = (ParserBase *)TVar4.info;
    SmallVectorBase<slang::parsing::Token>::push_back
              (in_stack_fffffffffffffec0,(Token *)in_stack_fffffffffffffeb8);
    bVar1 = ParserBase::peek(in_stack_fffffffffffffed0,in_stack_fffffffffffffece);
    if (bVar1) {
      std::optional<slang::DiagCode>::optional<const_slang::DiagCode_&,_true>
                ((optional<slang::DiagCode> *)in_stack_fffffffffffffec0,
                 (DiagCode *)in_stack_fffffffffffffeb8);
      ParserBase::skipToken
                (in_stack_ffffffffffffff88,(optional<slang::DiagCode>)in_stack_ffffffffffffff92);
    }
  }
  this_00 = (TokenList *)(in_RDI + 0x1c);
  _Var2._M_extent_value._0_4_ =
       SmallVectorBase<slang::parsing::Token>::copy
                 ((SmallVectorBase<slang::parsing::Token> *)&stack0xffffffffffffff90,
                  (EVP_PKEY_CTX *)*in_RDI,src);
  _Var2._M_extent_value._4_4_ = extraout_var;
  uVar5 = SUB86(extraout_RDX,0);
  uVar6 = (undefined2)((ulong)extraout_RDX >> 0x30);
  elements._M_extent._M_extent_value = _Var2._M_extent_value;
  elements._M_ptr = extraout_RDX;
  slang::syntax::TokenList::TokenList(this_00,elements);
  liblist_00.rawLen._2_2_ = uVar6;
  liblist_00._0_6_ = uVar5;
  liblist_00.info = (Info *)_Var2._M_extent_value;
  pCVar3 = slang::syntax::SyntaxFactory::configLiblist
                     ((SyntaxFactory *)this_00,liblist_00,in_stack_fffffffffffffeb8);
  SmallVector<slang::parsing::Token,_4UL>::~SmallVector
            ((SmallVector<slang::parsing::Token,_4UL> *)0x3214b9);
  return pCVar3;
}

Assistant:

ConfigLiblistSyntax& Parser::parseConfigLiblist() {
    auto liblist = expect(TokenKind::LibListKeyword);

    SmallVector<Token, 4> tokens;
    while (peek(TokenKind::Identifier)) {
        tokens.push_back(consume());
        if (peek(TokenKind::Comma))
            skipToken(diag::NoCommaInList);
    }

    return factory.configLiblist(liblist, tokens.copy(alloc));
}